

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

Extension * __thiscall
google::protobuf::internal::ExtensionSet::FindOrNull(ExtensionSet *this,int key)

{
  bool bVar1;
  KeyValue *pKVar2;
  KeyValue *end;
  KeyValue *it;
  int key_local;
  ExtensionSet *this_local;
  
  if (this->flat_size_ == 0) {
    this_local = (ExtensionSet *)0x0;
  }
  else {
    bVar1 = is_large(this);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_local = (ExtensionSet *)FindOrNullInLargeMap(this,key);
    }
    else {
      end = flat_begin(this);
      pKVar2 = flat_end(this);
      while( true ) {
        bVar1 = false;
        if (end != pKVar2) {
          bVar1 = end->first <= key;
        }
        if (!bVar1) {
          return (Extension *)0x0;
        }
        if (end->first == key) break;
        end = end + 1;
      }
      this_local = (ExtensionSet *)&end->second;
    }
  }
  return (Extension *)this_local;
}

Assistant:

const ExtensionSet::Extension* ExtensionSet::FindOrNull(int key) const {
  if (flat_size_ == 0) {
    return nullptr;
  } else if (ABSL_PREDICT_TRUE(!is_large())) {
    for (auto it = flat_begin(), end = flat_end();
         it != end && it->first <= key; ++it) {
      if (it->first == key) return &it->second;
    }
    return nullptr;
  } else {
    return FindOrNullInLargeMap(key);
  }
}